

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

void shadow_textprintf(ALLEGRO_FONT *font,int x,int y,ALLEGRO_COLOR col,int align,char *format,...)

{
  int x_00;
  char in_AL;
  undefined8 in_R9;
  int y_00;
  undefined4 uVar1;
  float fVar2;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  undefined8 local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined1 local_2e8 [40];
  undefined8 local_2c0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  char local_238 [520];
  
  local_2f8 = local_2e8;
  if (in_AL != '\0') {
    local_298 = in_XMM2_Qa;
    local_288 = in_XMM3_Qa;
    local_278 = in_XMM4_Qa;
    local_268 = in_XMM5_Qa;
    local_258 = in_XMM6_Qa;
    local_248 = in_XMM7_Qa;
  }
  local_300 = &stack0x00000008;
  local_308 = 0x5000000028;
  fVar2 = col.b;
  local_2c0 = in_R9;
  vsnprintf(local_238,0x200,format,&local_308);
  x_00 = x + shadow_offset;
  y_00 = shadow_offset + y;
  uVar1 = al_map_rgba(0,0,0,0x80);
  demo_textprintf_ex(font,x_00,y_00,align,0x11289a,uVar1,fVar2,local_238);
  demo_textprintf_ex(font,x,y,align,0x11289a,col.r,col.b,local_238);
  return;
}

Assistant:

void shadow_textprintf(ALLEGRO_FONT *font, int x, int y,
                     ALLEGRO_COLOR col, int align, const char *format, ...)
{
   char buf[512];

   va_list ap;

   va_start(ap, format);
   vsnprintf(buf, sizeof(buf), format, ap);
   va_end(ap);

   demo_textprintf_ex(font, x + shadow_offset, y + shadow_offset, al_map_rgba(0, 0, 0, 128),
                   align, "%s", buf);
   demo_textprintf_ex(font, x, y, col, align, "%s", buf);
}